

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError GropeDevice(snd_pcm_t *pcm,int isPlug,StreamDirection mode,int openBlocking,
                   PaAlsaDeviceInfo *devInfo)

{
  double dVar1;
  snd_pcm_uframes_t sVar2;
  snd_pcm_t *psVar3;
  int iVar4;
  int iVar5;
  pthread_t pVar6;
  char *pcVar7;
  size_t __n;
  long lVar8;
  long lVar9;
  long *__s;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 uStack_110;
  long local_108;
  long local_100;
  long local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  int local_b8;
  int local_b4;
  int __pa_unsure_error_id_9;
  int __pa_unsure_error_id_8;
  int __pa_unsure_error_id_7;
  int __pa_unsure_error_id_6;
  int __pa_unsure_error_id_5;
  int __pa_unsure_error_id_4;
  int __pa_unsure_error_id_3;
  int __pa_unsure_error_id_2;
  int __pa_unsure_error_id_1;
  uint sampleRate;
  size_t __alsa_alloca_size;
  int __pa_unsure_error_id;
  int dir;
  double defaultSr;
  double *defaultSampleRate;
  double *defaultHighLatency;
  double *defaultLowLatency;
  int *maxChannels;
  int *minChannels;
  uint maxChans;
  uint minChans;
  snd_pcm_uframes_t alsaPeriodFrames;
  snd_pcm_uframes_t alsaBufferFrames;
  snd_pcm_hw_params_t *hwParams;
  PaAlsaDeviceInfo *pPStack_28;
  PaError result;
  PaAlsaDeviceInfo *devInfo_local;
  StreamDirection local_18;
  int openBlocking_local;
  StreamDirection mode_local;
  int isPlug_local;
  snd_pcm_t *pcm_local;
  
  __s = &local_108;
  hwParams._4_4_ = 0;
  defaultSr = (double)&(devInfo->baseDeviceInfo).defaultSampleRate;
  ___pa_unsure_error_id = *(double *)defaultSr;
  pPStack_28 = devInfo;
  devInfo_local._4_4_ = openBlocking;
  local_18 = mode;
  openBlocking_local = isPlug;
  _mode_local = pcm;
  if (pcm == (snd_pcm_t *)0x0) {
    uStack_110 = 0x1161b4;
    __assert_fail("pcm",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                  ,0x34f,
                  "PaError GropeDevice(snd_pcm_t *, int, StreamDirection, int, PaAlsaDeviceInfo *)")
    ;
  }
  if (mode == StreamDirection_In) {
    maxChannels = &devInfo->minInputChannels;
    defaultLowLatency = (double *)&(devInfo->baseDeviceInfo).maxInputChannels;
    defaultHighLatency = &(devInfo->baseDeviceInfo).defaultLowInputLatency;
    defaultSampleRate = &(devInfo->baseDeviceInfo).defaultHighInputLatency;
  }
  else {
    maxChannels = &devInfo->minOutputChannels;
    defaultLowLatency = (double *)&(devInfo->baseDeviceInfo).maxOutputChannels;
    defaultHighLatency = &(devInfo->baseDeviceInfo).defaultLowOutputLatency;
    defaultSampleRate = &(devInfo->baseDeviceInfo).defaultHighOutputLatency;
  }
  uStack_110 = 0x11622e;
  __alsa_alloca_size._0_4_ = (*(code *)alsa_snd_pcm_nonblock)(pcm);
  if ((int)__alsa_alloca_size < 0) {
    uStack_110 = 0x116249;
    pVar6 = pthread_self();
    uStack_110 = 0x11625b;
    iVar4 = pthread_equal(pVar6,paUnixMainThread);
    if (iVar4 != 0) {
      local_c0 = (long)(int)__alsa_alloca_size;
      uStack_110 = 0x116277;
      pcVar7 = (*alsa_snd_strerror)((int)__alsa_alloca_size);
      uStack_110 = 0x11628b;
      PaUtil_SetLastHostErrorInfo(paALSA,local_c0,pcVar7);
    }
    uStack_110 = 0x116299;
    PaUtil_DebugPrint(
                     "Expression \'alsa_snd_pcm_nonblock( pcm, 0 )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 866\n"
                     );
  }
  else {
    uStack_110 = 0x1162b2;
    __n = (*(code *)alsa_snd_pcm_hw_params_sizeof)();
    lVar9 = -(__n + 0xf & 0xfffffffffffffff0);
    __s = (long *)((long)&local_108 + lVar9);
    ___pa_unsure_error_id_1 = __n;
    alsaBufferFrames = (snd_pcm_uframes_t)__s;
    *(undefined8 *)((long)&uStack_110 + lVar9) = 0x1162e7;
    memset(__s,0,__n);
    psVar3 = _mode_local;
    sVar2 = alsaBufferFrames;
    *(undefined8 *)((long)&uStack_110 + lVar9) = 0x1162f8;
    (*(code *)alsa_snd_pcm_hw_params_any)(psVar3,sVar2);
    psVar3 = _mode_local;
    sVar2 = alsaBufferFrames;
    dVar1 = ___pa_unsure_error_id;
    if (0.0 <= ___pa_unsure_error_id) {
      *(undefined8 *)((long)&uStack_110 + lVar9) = 0x116318;
      iVar4 = SetApproximateSampleRate(psVar3,(snd_pcm_hw_params_t *)sVar2,dVar1);
      psVar3 = _mode_local;
      sVar2 = alsaBufferFrames;
      if (iVar4 < 0) {
        ___pa_unsure_error_id = -1.0;
        *(undefined8 *)((long)&uStack_110 + lVar9) = 0x11633b;
        (*(code *)alsa_snd_pcm_hw_params_any)(psVar3,sVar2);
      }
    }
    psVar3 = _mode_local;
    sVar2 = alsaBufferFrames;
    if (0.0 <= ___pa_unsure_error_id) {
LAB_00116426:
      sVar2 = alsaBufferFrames;
      *(undefined8 *)((long)&uStack_110 + lVar9) = 0x116439;
      __pa_unsure_error_id_4 =
           (*(code *)alsa_snd_pcm_hw_params_get_channels_min)(sVar2,(long)&minChannels + 4);
      sVar2 = alsaBufferFrames;
      if (__pa_unsure_error_id_4 < 0) {
        *(undefined8 *)((long)&uStack_110 + lVar9) = 0x116457;
        pVar6 = pthread_self();
        *(undefined8 *)((long)&uStack_110 + lVar9) = 0x116469;
        iVar5 = pthread_equal(pVar6,paUnixMainThread);
        iVar4 = __pa_unsure_error_id_4;
        if (iVar5 != 0) {
          local_d0 = (long)__pa_unsure_error_id_4;
          *(undefined8 *)((long)&uStack_110 + lVar9) = 0x11648b;
          pcVar7 = (*alsa_snd_strerror)(iVar4);
          lVar8 = local_d0;
          *(undefined8 *)((long)&uStack_110 + lVar9) = 0x11649f;
          PaUtil_SetLastHostErrorInfo(paALSA,lVar8,pcVar7);
        }
        *(undefined8 *)((long)&uStack_110 + lVar9) = 0x1164ad;
        PaUtil_DebugPrint(
                         "Expression \'alsa_snd_pcm_hw_params_get_channels_min( hwParams, &minChans )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 897\n"
                         );
      }
      else {
        *(undefined8 *)((long)&uStack_110 + lVar9) = 0x1164ce;
        __pa_unsure_error_id_5 =
             (*(code *)alsa_snd_pcm_hw_params_get_channels_max)(sVar2,&minChannels);
        psVar3 = _mode_local;
        sVar2 = alsaBufferFrames;
        if (__pa_unsure_error_id_5 < 0) {
          *(undefined8 *)((long)&uStack_110 + lVar9) = 0x1164ec;
          pVar6 = pthread_self();
          *(undefined8 *)((long)&uStack_110 + lVar9) = 0x1164fe;
          iVar5 = pthread_equal(pVar6,paUnixMainThread);
          iVar4 = __pa_unsure_error_id_5;
          if (iVar5 != 0) {
            local_d8 = (long)__pa_unsure_error_id_5;
            *(undefined8 *)((long)&uStack_110 + lVar9) = 0x116520;
            pcVar7 = (*alsa_snd_strerror)(iVar4);
            lVar8 = local_d8;
            *(undefined8 *)((long)&uStack_110 + lVar9) = 0x116534;
            PaUtil_SetLastHostErrorInfo(paALSA,lVar8,pcVar7);
          }
          *(undefined8 *)((long)&uStack_110 + lVar9) = 0x116542;
          PaUtil_DebugPrint(
                           "Expression \'alsa_snd_pcm_hw_params_get_channels_max( hwParams, &maxChans )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 898\n"
                           );
        }
        else {
          if (0x7fffffff < (uint)minChannels) {
            *(undefined8 *)((long)&uStack_110 + lVar9) = 0x11657a;
            __assert_fail("maxChans <= INT_MAX",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                          ,899,
                          "PaError GropeDevice(snd_pcm_t *, int, StreamDirection, int, PaAlsaDeviceInfo *)"
                         );
          }
          if ((uint)minChannels == 0) {
            *(undefined8 *)((long)&uStack_110 + lVar9) = 0x1165a1;
            __assert_fail("maxChans > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                          ,900,
                          "PaError GropeDevice(snd_pcm_t *, int, StreamDirection, int, PaAlsaDeviceInfo *)"
                         );
          }
          if ((openBlocking_local != 0) && (0x80 < (uint)minChannels)) {
            minChannels._0_4_ = 0x80;
          }
          alsaPeriodFrames = 0x200;
          _maxChans = 0x80;
          *(undefined8 *)((long)&uStack_110 + lVar9) = 0x1165dc;
          __pa_unsure_error_id_6 =
               (*(code *)alsa_snd_pcm_hw_params_set_buffer_size_near)
                         (psVar3,sVar2,&alsaPeriodFrames);
          psVar3 = _mode_local;
          sVar2 = alsaBufferFrames;
          if (__pa_unsure_error_id_6 < 0) {
            *(undefined8 *)((long)&uStack_110 + lVar9) = 0x1165fa;
            pVar6 = pthread_self();
            *(undefined8 *)((long)&uStack_110 + lVar9) = 0x11660c;
            iVar5 = pthread_equal(pVar6,paUnixMainThread);
            iVar4 = __pa_unsure_error_id_6;
            if (iVar5 != 0) {
              local_e0 = (long)__pa_unsure_error_id_6;
              *(undefined8 *)((long)&uStack_110 + lVar9) = 0x11662e;
              pcVar7 = (*alsa_snd_strerror)(iVar4);
              lVar8 = local_e0;
              *(undefined8 *)((long)&uStack_110 + lVar9) = 0x116642;
              PaUtil_SetLastHostErrorInfo(paALSA,lVar8,pcVar7);
            }
            *(undefined8 *)((long)&uStack_110 + lVar9) = 0x116650;
            PaUtil_DebugPrint(
                             "Expression \'alsa_snd_pcm_hw_params_set_buffer_size_near( pcm, hwParams, &alsaBufferFrames )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 922\n"
                             );
          }
          else {
            *(undefined8 *)((long)&uStack_110 + lVar9) = 0x116679;
            __pa_unsure_error_id_7 =
                 (*alsa_snd_pcm_hw_params_set_period_size_near)
                           (psVar3,(snd_pcm_hw_params_t *)sVar2,(snd_pcm_uframes_t *)&maxChans,
                            (int *)((long)&__alsa_alloca_size + 4));
            psVar3 = _mode_local;
            sVar2 = alsaBufferFrames;
            if (__pa_unsure_error_id_7 < 0) {
              *(undefined8 *)((long)&uStack_110 + lVar9) = 0x116697;
              pVar6 = pthread_self();
              *(undefined8 *)((long)&uStack_110 + lVar9) = 0x1166a9;
              iVar5 = pthread_equal(pVar6,paUnixMainThread);
              iVar4 = __pa_unsure_error_id_7;
              if (iVar5 != 0) {
                local_e8 = (long)__pa_unsure_error_id_7;
                *(undefined8 *)((long)&uStack_110 + lVar9) = 0x1166cb;
                pcVar7 = (*alsa_snd_strerror)(iVar4);
                lVar8 = local_e8;
                *(undefined8 *)((long)&uStack_110 + lVar9) = 0x1166df;
                PaUtil_SetLastHostErrorInfo(paALSA,lVar8,pcVar7);
              }
              *(undefined8 *)((long)&uStack_110 + lVar9) = 0x1166ed;
              PaUtil_DebugPrint(
                               "Expression \'alsa_snd_pcm_hw_params_set_period_size_near( pcm, hwParams, &alsaPeriodFrames, &dir )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 923\n"
                               );
            }
            else {
              lVar8 = alsaPeriodFrames - _maxChans;
              auVar10._8_4_ = (int)((ulong)lVar8 >> 0x20);
              auVar10._0_8_ = lVar8;
              auVar10._12_4_ = 0x45300000;
              *defaultHighLatency =
                   ((auVar10._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)) /
                   ___pa_unsure_error_id;
              alsaPeriodFrames = 0x800;
              _maxChans = 0x200;
              *(undefined8 *)((long)&uStack_110 + lVar9) = 0x11675b;
              __pa_unsure_error_id_8 = (*(code *)alsa_snd_pcm_hw_params_any)(psVar3,sVar2);
              psVar3 = _mode_local;
              sVar2 = alsaBufferFrames;
              dVar1 = ___pa_unsure_error_id;
              if (__pa_unsure_error_id_8 < 0) {
                *(undefined8 *)((long)&uStack_110 + lVar9) = 0x116779;
                pVar6 = pthread_self();
                *(undefined8 *)((long)&uStack_110 + lVar9) = 0x11678b;
                iVar5 = pthread_equal(pVar6,paUnixMainThread);
                iVar4 = __pa_unsure_error_id_8;
                if (iVar5 != 0) {
                  local_f0 = (long)__pa_unsure_error_id_8;
                  *(undefined8 *)((long)&uStack_110 + lVar9) = 0x1167ad;
                  pcVar7 = (*alsa_snd_strerror)(iVar4);
                  lVar8 = local_f0;
                  *(undefined8 *)((long)&uStack_110 + lVar9) = 0x1167c1;
                  PaUtil_SetLastHostErrorInfo(paALSA,lVar8,pcVar7);
                }
                *(undefined8 *)((long)&uStack_110 + lVar9) = 0x1167cf;
                PaUtil_DebugPrint(
                                 "Expression \'alsa_snd_pcm_hw_params_any( pcm, hwParams )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 930\n"
                                 );
              }
              else {
                *(undefined8 *)((long)&uStack_110 + lVar9) = 0x1167f1;
                __pa_unsure_error_id_9 =
                     SetApproximateSampleRate(psVar3,(snd_pcm_hw_params_t *)sVar2,dVar1);
                psVar3 = _mode_local;
                sVar2 = alsaBufferFrames;
                if (__pa_unsure_error_id_9 < 0) {
                  *(undefined8 *)((long)&uStack_110 + lVar9) = 0x11680f;
                  pVar6 = pthread_self();
                  *(undefined8 *)((long)&uStack_110 + lVar9) = 0x116821;
                  iVar5 = pthread_equal(pVar6,paUnixMainThread);
                  iVar4 = __pa_unsure_error_id_9;
                  if (iVar5 != 0) {
                    local_f8 = (long)__pa_unsure_error_id_9;
                    *(undefined8 *)((long)&uStack_110 + lVar9) = 0x116843;
                    pcVar7 = (*alsa_snd_strerror)(iVar4);
                    lVar8 = local_f8;
                    *(undefined8 *)((long)&uStack_110 + lVar9) = 0x116857;
                    PaUtil_SetLastHostErrorInfo(paALSA,lVar8,pcVar7);
                  }
                  *(undefined8 *)((long)&uStack_110 + lVar9) = 0x116865;
                  PaUtil_DebugPrint(
                                   "Expression \'SetApproximateSampleRate( pcm, hwParams, defaultSr )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 931\n"
                                   );
                }
                else {
                  *(undefined8 *)((long)&uStack_110 + lVar9) = 0x11688a;
                  local_b4 = (*(code *)alsa_snd_pcm_hw_params_set_buffer_size_near)
                                       (psVar3,sVar2,&alsaPeriodFrames);
                  psVar3 = _mode_local;
                  sVar2 = alsaBufferFrames;
                  if (local_b4 < 0) {
                    *(undefined8 *)((long)&uStack_110 + lVar9) = 0x1168a8;
                    pVar6 = pthread_self();
                    *(undefined8 *)((long)&uStack_110 + lVar9) = 0x1168ba;
                    iVar5 = pthread_equal(pVar6,paUnixMainThread);
                    iVar4 = local_b4;
                    if (iVar5 != 0) {
                      local_100 = (long)local_b4;
                      *(undefined8 *)((long)&uStack_110 + lVar9) = 0x1168dc;
                      pcVar7 = (*alsa_snd_strerror)(iVar4);
                      lVar8 = local_100;
                      *(undefined8 *)((long)&uStack_110 + lVar9) = 0x1168f0;
                      PaUtil_SetLastHostErrorInfo(paALSA,lVar8,pcVar7);
                    }
                    *(undefined8 *)((long)&uStack_110 + lVar9) = 0x1168fe;
                    PaUtil_DebugPrint(
                                     "Expression \'alsa_snd_pcm_hw_params_set_buffer_size_near( pcm, hwParams, &alsaBufferFrames )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 932\n"
                                     );
                  }
                  else {
                    *(undefined8 *)((long)&uStack_110 + lVar9) = 0x116927;
                    local_b8 = (*alsa_snd_pcm_hw_params_set_period_size_near)
                                         (psVar3,(snd_pcm_hw_params_t *)sVar2,
                                          (snd_pcm_uframes_t *)&maxChans,
                                          (int *)((long)&__alsa_alloca_size + 4));
                    if (-1 < local_b8) {
                      lVar9 = alsaPeriodFrames - _maxChans;
                      auVar11._8_4_ = (int)((ulong)lVar9 >> 0x20);
                      auVar11._0_8_ = lVar9;
                      auVar11._12_4_ = 0x45300000;
                      *defaultSampleRate =
                           ((auVar11._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0)) /
                           ___pa_unsure_error_id;
                      *maxChannels = minChannels._4_4_;
                      *(uint *)defaultLowLatency = (uint)minChannels;
                      *(double *)defaultSr = ___pa_unsure_error_id;
                      goto LAB_00116a04;
                    }
                    *(undefined8 *)((long)&uStack_110 + lVar9) = 0x116945;
                    pVar6 = pthread_self();
                    *(undefined8 *)((long)&uStack_110 + lVar9) = 0x116957;
                    iVar5 = pthread_equal(pVar6,paUnixMainThread);
                    iVar4 = local_b8;
                    if (iVar5 != 0) {
                      local_108 = (long)local_b8;
                      *(undefined8 *)((long)&uStack_110 + lVar9) = 0x116979;
                      pcVar7 = (*alsa_snd_strerror)(iVar4);
                      lVar8 = local_108;
                      *(undefined8 *)((long)&uStack_110 + lVar9) = 0x11698d;
                      PaUtil_SetLastHostErrorInfo(paALSA,lVar8,pcVar7);
                    }
                    *(undefined8 *)((long)&uStack_110 + lVar9) = 0x11699b;
                    PaUtil_DebugPrint(
                                     "Expression \'alsa_snd_pcm_hw_params_set_period_size_near( pcm, hwParams, &alsaPeriodFrames, &dir )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 933\n"
                                     );
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      __pa_unsure_error_id_2 = 0xac44;
      *(undefined8 *)((long)&uStack_110 + lVar9) = 0x116368;
      (*(code *)alsa_snd_pcm_hw_params_set_rate_resample)(psVar3,sVar2,0);
      psVar3 = _mode_local;
      sVar2 = alsaBufferFrames;
      *(undefined8 *)((long)&uStack_110 + lVar9) = 0x116382;
      iVar4 = (*(code *)alsa_snd_pcm_hw_params_set_rate_near)
                        (psVar3,sVar2,&__pa_unsure_error_id_2,0);
      sVar2 = alsaBufferFrames;
      if (-1 < iVar4) {
        *(undefined8 *)((long)&uStack_110 + lVar9) = 0x1163a2;
        __pa_unsure_error_id_3 =
             GetExactSampleRate((snd_pcm_hw_params_t *)sVar2,(double *)&__pa_unsure_error_id);
        if (-1 < __pa_unsure_error_id_3) goto LAB_00116426;
        *(undefined8 *)((long)&uStack_110 + lVar9) = 0x1163c0;
        pVar6 = pthread_self();
        *(undefined8 *)((long)&uStack_110 + lVar9) = 0x1163d2;
        iVar5 = pthread_equal(pVar6,paUnixMainThread);
        iVar4 = __pa_unsure_error_id_3;
        if (iVar5 != 0) {
          local_c8 = (long)__pa_unsure_error_id_3;
          *(undefined8 *)((long)&uStack_110 + lVar9) = 0x1163f4;
          pcVar7 = (*alsa_snd_strerror)(iVar4);
          lVar8 = local_c8;
          *(undefined8 *)((long)&uStack_110 + lVar9) = 0x116408;
          PaUtil_SetLastHostErrorInfo(paALSA,lVar8,pcVar7);
        }
        *(undefined8 *)((long)&uStack_110 + lVar9) = 0x116416;
        PaUtil_DebugPrint(
                         "Expression \'GetExactSampleRate( hwParams, &defaultSr )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 894\n"
                         );
      }
    }
  }
  hwParams._4_4_ = -9999;
LAB_00116a04:
  psVar3 = _mode_local;
  *(undefined8 *)((long)__s + -8) = 0x116a11;
  (*(code *)alsa_snd_pcm_close)(psVar3);
  return hwParams._4_4_;
}

Assistant:

static PaError GropeDevice( snd_pcm_t* pcm, int isPlug, StreamDirection mode, int openBlocking,
        PaAlsaDeviceInfo* devInfo )
{
    PaError result = paNoError;
    snd_pcm_hw_params_t *hwParams;
    snd_pcm_uframes_t alsaBufferFrames, alsaPeriodFrames;
    unsigned int minChans, maxChans;
    int* minChannels, * maxChannels;
    double * defaultLowLatency, * defaultHighLatency, * defaultSampleRate =
        &devInfo->baseDeviceInfo.defaultSampleRate;
    double defaultSr = *defaultSampleRate;
    int dir;

    assert( pcm );

    PA_DEBUG(( "%s: collecting info ..\n", __FUNCTION__ ));

    if( StreamDirection_In == mode )
    {
        minChannels = &devInfo->minInputChannels;
        maxChannels = &devInfo->baseDeviceInfo.maxInputChannels;
        defaultLowLatency = &devInfo->baseDeviceInfo.defaultLowInputLatency;
        defaultHighLatency = &devInfo->baseDeviceInfo.defaultHighInputLatency;
    }
    else
    {
        minChannels = &devInfo->minOutputChannels;
        maxChannels = &devInfo->baseDeviceInfo.maxOutputChannels;
        defaultLowLatency = &devInfo->baseDeviceInfo.defaultLowOutputLatency;
        defaultHighLatency = &devInfo->baseDeviceInfo.defaultHighOutputLatency;
    }

    ENSURE_( alsa_snd_pcm_nonblock( pcm, 0 ), paUnanticipatedHostError );

    alsa_snd_pcm_hw_params_alloca( &hwParams );
    alsa_snd_pcm_hw_params_any( pcm, hwParams );

    if( defaultSr >= 0 )
    {
        /* Could be that the device opened in one mode supports samplerates that the other mode wont have,
         * so try again .. */
        if( SetApproximateSampleRate( pcm, hwParams, defaultSr ) < 0 )
        {
            defaultSr = -1.;
            alsa_snd_pcm_hw_params_any( pcm, hwParams ); /* Clear any params (rate) that might have been set */
            PA_DEBUG(( "%s: Original default samplerate failed, trying again ..\n", __FUNCTION__ ));
        }
    }

    if( defaultSr < 0. )           /* Default sample rate not set */
    {
        unsigned int sampleRate = 44100;        /* Will contain approximate rate returned by alsa-lib */

        /* Don't allow rate resampling when probing for the default rate (but ignore if this call fails) */
        alsa_snd_pcm_hw_params_set_rate_resample( pcm, hwParams, 0 );
        if( alsa_snd_pcm_hw_params_set_rate_near( pcm, hwParams, &sampleRate, NULL ) < 0 )
        {
            result = paUnanticipatedHostError;
            goto error;
        }
        ENSURE_( GetExactSampleRate( hwParams, &defaultSr ), paUnanticipatedHostError );
    }

    ENSURE_( alsa_snd_pcm_hw_params_get_channels_min( hwParams, &minChans ), paUnanticipatedHostError );
    ENSURE_( alsa_snd_pcm_hw_params_get_channels_max( hwParams, &maxChans ), paUnanticipatedHostError );
    assert( maxChans <= INT_MAX );
    assert( maxChans > 0 );    /* Weird linking issue could cause wrong version of ALSA symbols to be called,
                                   resulting in zeroed values */

    /* XXX: Limit to sensible number (ALSA plugins accept a crazy amount of channels)? */
    if( isPlug && maxChans > 128 )
    {
        maxChans = 128;
        PA_DEBUG(( "%s: Limiting number of plugin channels to %u\n", __FUNCTION__, maxChans ));
    }

    /* TWEAKME:
     * Giving values for default min and max latency is not straightforward.
     *  * for low latency, we want to give the lowest value that will work reliably.
     *      This varies based on the sound card, kernel, CPU, etc.  Better to give
     *      sub-optimal latency than to give a number too low and cause dropouts.
     *  * for high latency we want to give a large enough value that dropouts are basically impossible.
     *      This doesn't really require as much tweaking, since providing too large a number will
     *      just cause us to select the nearest setting that will work at stream config time.
     */
    /* Try low latency values, (sometimes the buffer & period that result are larger) */
    alsaBufferFrames = 512;
    alsaPeriodFrames = 128;
    ENSURE_( alsa_snd_pcm_hw_params_set_buffer_size_near( pcm, hwParams, &alsaBufferFrames ), paUnanticipatedHostError );
    ENSURE_( alsa_snd_pcm_hw_params_set_period_size_near( pcm, hwParams, &alsaPeriodFrames, &dir ), paUnanticipatedHostError );
    *defaultLowLatency = (double) (alsaBufferFrames - alsaPeriodFrames) / defaultSr;

    /* Base the high latency case on values four times larger */
    alsaBufferFrames = 2048;
    alsaPeriodFrames = 512;
    /* Have to reset hwParams, to set new buffer size; need to also set sample rate again */
    ENSURE_( alsa_snd_pcm_hw_params_any( pcm, hwParams ), paUnanticipatedHostError );
    ENSURE_( SetApproximateSampleRate( pcm, hwParams, defaultSr ), paUnanticipatedHostError );
    ENSURE_( alsa_snd_pcm_hw_params_set_buffer_size_near( pcm, hwParams, &alsaBufferFrames ), paUnanticipatedHostError );
    ENSURE_( alsa_snd_pcm_hw_params_set_period_size_near( pcm, hwParams, &alsaPeriodFrames, &dir ), paUnanticipatedHostError );
    *defaultHighLatency = (double) (alsaBufferFrames - alsaPeriodFrames) / defaultSr;

    *minChannels = (int)minChans;
    *maxChannels = (int)maxChans;
    *defaultSampleRate = defaultSr;

end:
    alsa_snd_pcm_close( pcm );
    return result;

error:
    goto end;
}